

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

void __thiscall
wasm::
SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
::insert(SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
         *this,HeapType *x)

{
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  *puVar1;
  InsertResult IVar2;
  __hashtable *__h;
  long lVar3;
  __hashtable *__h_1;
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  __node_gen_type __node_gen;
  
  if ((this->flexible)._M_h._M_element_count == 0) {
    IVar2 = UnorderedFixedStorage<wasm::HeapType,_5UL>::insert(&this->fixed,x);
    if (IVar2 == CouldNotInsert) {
      if ((this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used != 5) {
        __assert_fail("fixed.used == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa7,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      if ((this->flexible)._M_h._M_element_count != 0) {
        __assert_fail("flexible.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xa8,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      puVar1 = &this->flexible;
      lVar3 = 8;
      local_38 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar1;
      do {
        std::
        _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::HeapType&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                  ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)puVar1,
                   (long)((this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.storage._M_elems
                         + -1) + lVar3,&local_38);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x30);
      local_38 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar1;
      std::
      _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar1,x);
      if ((this->flexible)._M_h._M_element_count == 0) {
        __assert_fail("!usingFixed()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0xac,
                      "void wasm::SmallSetBase<wasm::HeapType, 5, wasm::UnorderedFixedStorage<wasm::HeapType, 5>, std::unordered_set<wasm::HeapType>>::insert(const T &) [T = wasm::HeapType, N = 5, FixedStorage = wasm::UnorderedFixedStorage<wasm::HeapType, 5>, FlexibleSet = std::unordered_set<wasm::HeapType>]"
                     );
      }
      (this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used = 0;
    }
  }
  else {
    local_38 = (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->flexible;
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
              (local_38,x);
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }